

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O0

void __thiscall
nuraft::raft_server::on_retryable_req_err(raft_server *this,ptr<peer> *p,ptr<req_msg> *req)

{
  bool bVar1;
  int iVar2;
  msg_type mVar3;
  uint uVar4;
  undefined8 uVar5;
  element_type *peVar6;
  element_type *peVar7;
  long in_RDI;
  msg_type in_stack_0000008c;
  rpc_handler *in_stack_000000c8;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  peer *in_stack_ffffffffffffff20;
  string local_98 [64];
  string local_58 [32];
  string local_38 [56];
  
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
  if (bVar1) {
    peVar6 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x27c502);
    iVar2 = (**(code **)(*(long *)peVar6 + 0x38))();
    if (4 < iVar2) {
      peVar6 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x27c525);
      peVar7 = std::__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x27c537);
      msg_base::get_type(&peVar7->super_msg_base);
      msg_type_to_string_abi_cxx11_(in_stack_0000008c);
      uVar5 = std::__cxx11::string::c_str();
      std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x27c56f);
      uVar4 = peer::get_id((peer *)0x27c577);
      msg_if_given_abi_cxx11_((char *)local_38,"retry the request %s for %d",uVar5,(ulong)uVar4);
      (**(code **)(*(long *)peVar6 + 0x40))
                (peVar6,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"on_retryable_req_err",0x5e9,local_38);
      std::__cxx11::string::~string(local_38);
      std::__cxx11::string::~string(local_58);
    }
  }
  std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x27c641
            );
  bVar1 = peer::make_busy(in_stack_ffffffffffffff20);
  if (bVar1) {
    std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x27c65f);
    std::shared_ptr<nuraft::peer>::shared_ptr
              ((shared_ptr<nuraft::peer> *)in_stack_ffffffffffffff20,
               (shared_ptr<nuraft::peer> *)
               CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    peer::send_req((peer *)this,p,req,in_stack_000000c8);
    std::shared_ptr<nuraft::peer>::~shared_ptr((shared_ptr<nuraft::peer> *)0x27c6aa);
  }
  else {
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
    if (bVar1) {
      peVar6 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x27c6fd);
      iVar2 = (**(code **)(*(long *)peVar6 + 0x38))();
      if (1 < iVar2) {
        peVar6 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x27c720);
        peVar7 = std::__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x27c732);
        mVar3 = msg_base::get_type(&peVar7->super_msg_base);
        std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x27c74b);
        uVar4 = peer::get_id((peer *)0x27c753);
        msg_if_given_abi_cxx11_
                  ((char *)local_98,"retry request %d failed: peer %d is busy",(ulong)mVar3,
                   (ulong)uVar4);
        (**(code **)(*(long *)peVar6 + 0x40))
                  (peVar6,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                   ,"on_retryable_req_err",0x5ee,local_98);
        std::__cxx11::string::~string(local_98);
      }
    }
  }
  return;
}

Assistant:

void raft_server::on_retryable_req_err(ptr<peer>& p, ptr<req_msg>& req) {
    p_db( "retry the request %s for %d",
          msg_type_to_string(req->get_type()).c_str(), p->get_id() );
    if (p->make_busy()) {
        p->send_req(p, req, ex_resp_handler_);
    } else {
        p_er("retry request %d failed: peer %d is busy",
             req->get_type(), p->get_id());
    }
}